

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void jmp_ensure_true_falls_through(Parser *psr,Node *node)

{
  int iVar1;
  BcIns *pBVar2;
  BcOp BVar3;
  int iVar4;
  
  iVar1 = (node->field_1).reloc_idx;
  if ((node->field_1).jmp.false_list < iVar1) {
    pBVar2 = psr->vm->fns[psr->scope->fn].ins;
    BVar3 = relop_invert((uint)(byte)pBVar2[(long)iVar1 + -1]);
    pBVar2[(long)iVar1 + -1] = pBVar2[(long)iVar1 + -1] & 0xffffff00 | BVar3;
    iVar1 = (node->field_1).reloc_idx;
    iVar4 = jmp_follow(psr,iVar1);
    (node->field_1).reloc_idx = iVar4;
    jmp_list_append(psr,&(node->field_1).jmp.false_list,iVar1);
    return;
  }
  return;
}

Assistant:

static void jmp_ensure_true_falls_through(Parser *psr, Node *node) {
	// Note `true_list` and `false_list` point to the JMP instruction with the
	// LARGEST PC in the true and false case jump lists. Thus if the true list
	// comes last, then the false case must fall through. We don't want this -
	// we want the true case to fall through - so invert the last instruction.
	if (node->jmp.true_list > node->jmp.false_list) {
		// Invert the condition
		BcIns *cond = &psr_fn(psr)->ins[node->jmp.true_list - 1];
		BcOp inverted = relop_invert(bc_op(*cond));
		bc_set_op(cond, inverted);

		// Remove this particular jump from the true list
		int tmp = node->jmp.true_list;
		node->jmp.true_list = jmp_follow(psr, node->jmp.true_list);

		// Add the jump to the false list
		jmp_list_append(psr, &node->jmp.false_list, tmp);
	}
}